

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.cpp
# Opt level: O0

type_conflict1 __thiscall
llama_model_loader::get_arr_n<unsigned_int>
          (llama_model_loader *this,string *key,uint *result,bool required)

{
  pointer pgVar1;
  undefined8 uVar2;
  runtime_error *this_00;
  undefined1 in_CL;
  gguf_context *in_RDX;
  unique_ptr<gguf_context,_gguf_context_deleter> *in_RDI;
  ArrayInfo arr_info;
  int kid;
  undefined4 local_68;
  string local_48 [32];
  int local_28;
  undefined3 in_stack_ffffffffffffffdc;
  uint k;
  type_conflict1 local_1;
  
  k = CONCAT13(in_CL,in_stack_ffffffffffffffdc) & 0x1ffffff;
  pgVar1 = std::unique_ptr<gguf_context,_gguf_context_deleter>::get(in_RDI);
  uVar2 = std::__cxx11::string::c_str();
  local_28 = gguf_find_key(pgVar1,uVar2);
  if (local_28 < 0) {
    if ((k & 0x1000000) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      uVar2 = std::__cxx11::string::c_str();
      format_abi_cxx11_((char *)local_48,"key not found in model: %s",uVar2);
      std::runtime_error::runtime_error(this_00,local_48);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1 = false;
  }
  else {
    std::unique_ptr<gguf_context,_gguf_context_deleter>::get(in_RDI);
    GGUFMeta::GKV<GGUFMeta::ArrayInfo>::get_kv(in_RDX,k);
    *(undefined4 *)in_RDX = local_68;
    local_1 = true;
  }
  return local_1;
}

Assistant:

typename std::enable_if<std::is_integral<T>::value, bool>::type
    llama_model_loader::get_arr_n(const std::string & key, T & result, bool required) {
        const int kid = gguf_find_key(meta.get(), key.c_str());

        if (kid < 0) {
            if (required) {
                throw std::runtime_error(format("key not found in model: %s", key.c_str()));
            }
            return false;
        }

        struct GGUFMeta::ArrayInfo arr_info =
            GGUFMeta::GKV<GGUFMeta::ArrayInfo>::get_kv(meta.get(), kid);


        result = arr_info.length;
        return true;
    }